

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void do_cmd_buy(command *cmd)

{
  ulong uVar1;
  byte bVar2;
  loc grid;
  player_upkeep *ppVar3;
  player *p;
  _Bool _Var4;
  wchar_t wVar5;
  uint32_t uVar6;
  store *store;
  object *poVar7;
  int iVar8;
  char *fmt;
  bool bVar9;
  object *bought;
  object *obj;
  wchar_t amt;
  char o_name [80];
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  store = store_at((chunk *)cave,grid);
  if (store == (store *)0x0) {
    msg("You cannot purchase items when not in a store.");
    return;
  }
  wVar5 = cmd_get_arg_item((command_conflict *)cmd,"item",&obj);
  if (wVar5 == L'\0') {
    _Var4 = pile_contains(store->stock,obj);
    if (_Var4) {
      wVar5 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&amt);
      if (wVar5 == L'\0') {
        poVar7 = object_new();
        bought = poVar7;
        object_copy_amt(poVar7,obj,amt);
        bVar2 = poVar7->number;
        wVar5 = inven_carry_num(player,poVar7);
        if (wVar5 < (int)(uint)bVar2) {
          fmt = "You cannot carry that many items.";
        }
        else {
          object_desc(o_name,0x50,poVar7,0x43,player);
          wVar5 = price_item(store,bought,false,(uint)bought->number);
          p = player;
          if (wVar5 <= player->au) {
            player->au = player->au - wVar5;
            ppVar3 = p->upkeep;
            uVar1._0_4_ = ppVar3->notice;
            uVar1._4_4_ = ppVar3->update;
            ppVar3->notice = (int)(uVar1 | 0x40000000003);
            ppVar3->update = (int)((uVar1 | 0x40000000003) >> 0x20);
            object_desc(o_name,0x50,bought,0x43,p);
            uVar6 = Rand_div(3);
            if (uVar6 == 0) {
              uVar6 = Rand_div(6);
              msgt(0x56,"%s",
                   comment_accept_rel + *(int *)(comment_accept_rel + (long)(int)uVar6 * 4));
            }
            msg("You bought %s for %d gold.",o_name,(ulong)(uint)wVar5);
            bought->note = 0;
            if (bought->origin == '\0') {
              bought->origin = '\x10';
            }
            _Var4 = tval_can_have_charges(obj);
            if (_Var4) {
              obj->pval = obj->pval - bought->pval;
            }
            poVar7 = object_new();
            object_copy(poVar7,obj->known);
            bought->known = poVar7;
            object_flavor_aware(player,bought);
            bought->known->effect = bought->effect;
            while (_Var4 = object_fully_known(bought), !_Var4) {
              object_learn_unknown_rune(player,bought,true);
              player_know_object(player,bought);
            }
            inven_carry(player,bought,true,true);
            handle_stuff(player);
            _Var4 = store_sale_should_reduce_stock(store,obj);
            if ((_Var4) && (store_delete(store,obj,amt), store->stock_num == '\0')) {
              uVar6 = Rand_div((uint)z_info->store_shuffle);
              if (uVar6 == 0) {
                msg("The shopkeeper retires.");
                store_shuffle(store);
              }
              else {
                msg("The shopkeeper brings out some new stock.");
              }
              iVar8 = 10;
              while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
                store_maint(store);
              }
            }
            event_signal(EVENT_STORECHANGED);
            event_signal(EVENT_INVENTORY);
            event_signal(EVENT_EQUIPMENT);
            return;
          }
          fmt = "You cannot afford that purchase.";
        }
        msg(fmt);
        object_delete((chunk *)0x0,(chunk *)0x0,&bought);
      }
    }
    else {
      msg("You cannot buy that item because it\'s not in the store.");
    }
  }
  return;
}

Assistant:

void do_cmd_buy(struct command *cmd)
{
	int amt;

	struct object *obj, *bought, *known_obj;

	char o_name[80];
	int price;

	struct store *store = store_at(cave, player->grid);

	if (!store) {
		msg("You cannot purchase items when not in a store.");
		return;
	}

	/* Get arguments */
	/* XXX-AS fill this out, split into cmd-store.c */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK)
		return;

	if (!pile_contains(store->stock, obj)) {
		msg("You cannot buy that item because it's not in the store.");
		return;
	}

	if (cmd_get_arg_number(cmd, "quantity", &amt) != CMD_OK)
		return;

	/* Get desired object */
	bought = object_new();
	object_copy_amt(bought, obj, amt);

	/* Ensure we have room */
	if (bought->number > inven_carry_num(player, bought)) {
		msg("You cannot carry that many items.");
		object_delete(NULL, NULL, &bought);
		return;
	}

	/* Describe the object (fully) */
	object_desc(o_name, sizeof(o_name), bought, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Extract the price for the entire stack */
	price = price_item(store, bought, false, bought->number);

	if (price > player->au) {
		msg("You cannot afford that purchase.");
		object_delete(NULL, NULL, &bought);
		return;
	}

	/* Spend the money */
	player->au -= price;

	/* Update the gear */
	player->upkeep->update |= (PU_INVEN);

	/* Combine the pack (later) */
	player->upkeep->notice |= (PN_COMBINE | PN_IGNORE);

	/* Describe the object (fully) again for the message */
	object_desc(o_name, sizeof(o_name), bought, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Message */
	if (one_in_(3)) msgt(MSG_STORE5, "%s", ONE_OF(comment_accept));
	msg("You bought %s for %d gold.", o_name, price);

	/* Erase the inscription */
	bought->note = 0;

	/* Give it an origin if it doesn't have one */
	if (bought->origin == ORIGIN_NONE)
		bought->origin = ORIGIN_STORE;

	/* Hack - Reduce the number of charges in the original stack */
	if (tval_can_have_charges(obj))
		obj->pval -= bought->pval;

	/* Make a known object */
	known_obj = object_new();
	object_copy(known_obj, obj->known);
	bought->known = known_obj;

	/* Learn flavor, any effect and all the runes */
	object_flavor_aware(player, bought);
	bought->known->effect = bought->effect;
	while (!object_fully_known(bought)) {
		object_learn_unknown_rune(player, bought, true);
		player_know_object(player, bought);
	}

	/* Give it to the player */
	inven_carry(player, bought, true, true);

	/* Handle stuff */
	handle_stuff(player);

	/* Remove the bought objects from the store if it's not a readily
	 * replaced staple item */
	if (store_sale_should_reduce_stock(store, obj)) {
		/* Reduce or remove the item */
		store_delete(store, obj, amt);

		/* Store is empty */
		if (store->stock_num == 0) {
			int i;

			/* Sometimes shuffle the shopkeeper */
			if (one_in_(z_info->store_shuffle)) {
				/* Shuffle */
				msg("The shopkeeper retires.");
				store_shuffle(store);
			} else
				/* Maintain */
				msg("The shopkeeper brings out some new stock.");

			/* New inventory */
			for (i = 0; i < 10; ++i)
				store_maint(store);
		}
	}

	event_signal(EVENT_STORECHANGED);
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}